

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O3

void __thiscall
llvm::SmallPtrSetImplBase::SmallPtrSetImplBase
          (SmallPtrSetImplBase *this,void **SmallStorage,SmallPtrSetImplBase *that)

{
  void **ppvVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  
  this->SmallArray = SmallStorage;
  ppvVar1 = that->SmallArray;
  ppvVar3 = that->CurArray;
  if ((that->CurArray != ppvVar1) &&
     (SmallStorage = (void **)malloc((ulong)that->CurArraySize << 3), ppvVar3 = ppvVar1,
     SmallStorage == (void **)0x0)) {
    report_bad_alloc_error("Allocation failed",true);
  }
  this->CurArray = SmallStorage;
  uVar4 = that->CurArraySize;
  this->CurArraySize = uVar4;
  uVar2 = that->NumNonEmpty;
  if (that->CurArray == ppvVar3) {
    uVar4 = uVar2;
  }
  if (uVar4 != 0) {
    memmove(SmallStorage,that->CurArray,(ulong)uVar4 << 3);
    uVar2 = that->NumNonEmpty;
  }
  this->NumNonEmpty = uVar2;
  this->NumTombstones = that->NumTombstones;
  return;
}

Assistant:

SmallPtrSetImplBase::SmallPtrSetImplBase(const void **SmallStorage,
                                         const SmallPtrSetImplBase &that) {
  SmallArray = SmallStorage;

  // If we're becoming small, prepare to insert into our stack space
  if (that.isSmall()) {
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else {
    CurArray = (const void**)safe_malloc(sizeof(void*) * that.CurArraySize);
  }

  // Copy over the that array.
  CopyHelper(that);
}